

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O2

void cm_zlib__tr_init(deflate_state *s)

{
  (s->l_desc).dyn_tree = s->dyn_ltree;
  (s->l_desc).stat_desc = &static_l_desc;
  (s->d_desc).dyn_tree = s->dyn_dtree;
  (s->d_desc).stat_desc = &static_d_desc;
  (s->bl_desc).dyn_tree = s->bl_tree;
  (s->bl_desc).stat_desc = &static_bl_desc;
  s->bi_buf = 0;
  s->bi_valid = 0;
  s->last_eob_len = 8;
  init_block(s);
  return;
}

Assistant:

void _tr_init(s)
    deflate_state *s;
{
    tr_static_init();

    s->l_desc.dyn_tree = s->dyn_ltree;
    s->l_desc.stat_desc = &static_l_desc;

    s->d_desc.dyn_tree = s->dyn_dtree;
    s->d_desc.stat_desc = &static_d_desc;

    s->bl_desc.dyn_tree = s->bl_tree;
    s->bl_desc.stat_desc = &static_bl_desc;

    s->bi_buf = 0;
    s->bi_valid = 0;
    s->last_eob_len = 8; /* enough lookahead for inflate */
#ifdef DEBUG
    s->compressed_len = 0L;
    s->bits_sent = 0L;
#endif

    /* Initialize the first block of the first file: */
    init_block(s);
}